

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall CVmTimeZone::~CVmTimeZone(CVmTimeZone *this)

{
  long in_RDI;
  
  lib_free_str((char *)0x34f92c);
  if ((*(long *)(in_RDI + 0x18) != 0) && (*(void **)(in_RDI + 0x18) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x18));
  }
  if ((*(long *)(in_RDI + 0x28) != 0) && (*(void **)(in_RDI + 0x28) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  if ((*(long *)(in_RDI + 0x38) != 0) && (*(void **)(in_RDI + 0x38) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x38));
  }
  if ((*(long *)(in_RDI + 0x40) != 0) && (*(void **)(in_RDI + 0x40) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x40));
  }
  if ((*(long *)(in_RDI + 0x60) != 0) && (*(void **)(in_RDI + 0x60) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x60));
  }
  return;
}

Assistant:

CVmTimeZone::~CVmTimeZone()
{
    /* delete allocated items */
    lib_free_str(name_);
    if (trans_ != 0)
        delete [] trans_;
    if (ttype_ != 0)
        delete [] ttype_;
    if (rule_ != 0)
        delete [] rule_;
    if (abbr_ != 0)
        delete [] abbr_;
    if (desc_ != 0)
        delete [] desc_;
}